

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall
CoinSelection_SelectCoins_Simple_SelectCoinsBnB_single_Test::TestBody
          (CoinSelection_SelectCoins_Simple_SelectCoinsBnB_single_Test *this)

{
  uint32_t vout;
  pointer pTVar1;
  bool bVar2;
  string *output_descriptor;
  pointer pTVar3;
  pointer puVar4;
  char *pcVar5;
  CoinSelectionOption *in_R9;
  pointer utxo;
  _func_int **pp_Var6;
  pointer puVar7;
  Amount AVar8;
  bool use_bnb;
  Amount local_188;
  AssertionResult gtest_ar_;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  Txid txid;
  AssertHelper local_130;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelection coin_select;
  Amount local_d8;
  Amount fee_value;
  Amount select_value;
  Amount local_a8;
  CoinSelectionOption option_params;
  
  cfd::CoinSelection::CoinSelection(&coin_select,true);
  AVar8 = cfd::core::Amount::CreateBySatoshiAmount(0x93e0a40);
  local_a8.amount_ = AVar8.amount_;
  local_a8.ignore_check_ = AVar8.ignore_check_;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee_value);
  AVar8 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_d8.amount_ = AVar8.amount_;
  local_d8.ignore_check_ = AVar8.ignore_check_;
  use_bnb = false;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectTestVector.
                           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)kExtCoinSelectTestVector.
                           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pTVar1 = kExtCoinSelectTestVector.
           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (kExtCoinSelectTestVector.
      super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      kExtCoinSelectTestVector.
      super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    output_descriptor =
         &(kExtCoinSelectTestVector.
           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
           super__Vector_impl_data._M_start)->descriptor;
    utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&txid);
      if (*(long *)((long)&output_descriptor[-2].field_2 + 8) != 0) {
        cfd::core::Txid::Txid((Txid *)&gtest_ar_,(string *)&output_descriptor[-2].field_2);
        cfd::core::Txid::operator=(&txid,(Txid *)&gtest_ar_);
        gtest_ar_._0_8_ = &PTR__Txid_0087c9b8;
        if (gtest_ar_.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(gtest_ar_.message_.ptr_,local_168._8_8_ - (long)gtest_ar_.message_.ptr_);
        }
      }
      vout = *(uint32_t *)&output_descriptor[-1].field_2;
      AVar8 = cfd::core::Amount::CreateBySatoshiAmount
                        (*(int64_t *)((long)&output_descriptor[-1].field_2 + 8));
      local_188.amount_ = AVar8.amount_;
      local_188.ignore_check_ = AVar8.ignore_check_;
      gtest_ar_._0_8_ = &local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_,"");
      in_R9 = (CoinSelectionOption *)0x0;
      cfd::CoinSelection::ConvertToUtxo
                (&txid,vout,output_descriptor,&local_188,(string *)&gtest_ar_,(void *)0x0,utxo,
                 (Script *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar_._0_8_ != &local_168) {
        operator_delete((void *)gtest_ar_._0_8_,local_168._M_allocated_capacity + 1);
      }
      txid._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txid.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      utxo = utxo + 1;
      pTVar3 = (pointer)(output_descriptor + 1);
      output_descriptor = (string *)&output_descriptor[2].field_2;
    } while (pTVar3 != pTVar1);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo(&option_params);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,2.0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    puVar4 = (pointer)0x0;
    pp_Var6 = (_func_int **)0x0;
    puVar7 = (pointer)0x0;
    if (bVar2) {
      in_R9 = &option_params;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&coin_select,&local_a8,
                 &utxos,&exp_filter,in_R9,&local_d8,&select_value,&fee_value,&use_bnb);
      puVar4 = txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pp_Var6 = txid._vptr_Txid;
      puVar7 = txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
  }
  else {
    testing::Message::Message((Message *)&txid);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1d8,
               "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (txid._vptr_Txid != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (txid._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*txid._vptr_Txid + 8))();
      }
      txid._vptr_Txid = (_func_int **)0x0;
    }
    puVar4 = (pointer)0x0;
    puVar7 = (pointer)0x0;
    pp_Var6 = (_func_int **)0x0;
  }
  gtest_ar_._0_8_ = ((long)puVar7 - (long)pp_Var6 >> 3) * -0x7b425ed097b425ed;
  local_188.amount_ = CONCAT44(local_188.amount_._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"select_utxos.size()","1",(unsigned_long *)&gtest_ar_,
             (int *)&local_188);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1d9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if (gtest_ar_._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&select_value);
  local_188.amount_ = (int64_t)&DAT_093e10e4;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&txid,"select_value.GetSatoshiValue()","static_cast<int64_t>(155062500)",
             (long *)&gtest_ar_,&local_188.amount_);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1da,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if (gtest_ar_._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee_value);
  local_188.amount_ = (int64_t)&DAT_000000b8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&txid,"fee_value.GetSatoshiValue()","static_cast<int64_t>(184)",
             (long *)&gtest_ar_,&local_188.amount_);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1db,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if (gtest_ar_._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)puVar7 - (long)pp_Var6 == 0xd8) {
    gtest_ar_._0_8_ = &DAT_093e10e4;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"select_utxos[0].amount","static_cast<int64_t>(155062500)",
               (unsigned_long *)(pp_Var6 + 0x10),(long *)&gtest_ar_);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x1dd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
      if (gtest_ar_._0_8_ != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&txid.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_.success_ = use_bnb;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (use_bnb == false) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&txid,(internal *)&gtest_ar_,(AssertionResult *)"use_bnb","false","true",
               &in_R9->use_bnb_);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1df,(char *)txid._vptr_Txid);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (txid._vptr_Txid !=
        (_func_int **)
        &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete(txid._vptr_Txid,
                      (ulong)(txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    if ((long *)local_188.amount_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_188.amount_ != (long *)0x0)) {
        (**(code **)(*(long *)local_188.amount_ + 8))();
      }
      local_188.amount_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (pp_Var6 != (_func_int **)0x0) {
    operator_delete(pp_Var6,(long)puVar4 - (long)pp_Var6);
  }
  option_params.fee_asset_._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if (option_params.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option_params.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)option_params.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)option_params.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_SelectCoinsBnB_single)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(155060800);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(2);

  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)));
  EXPECT_EQ(select_utxos.size(), 1);
  EXPECT_EQ(select_value.GetSatoshiValue(), static_cast<int64_t>(155062500));
  EXPECT_EQ(fee_value.GetSatoshiValue(), static_cast<int64_t>(184));
  if (select_utxos.size() == 1) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(155062500));
  }
  EXPECT_TRUE(use_bnb);
}